

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

Name __thiscall wasm::WasmBinaryReader::getInlineString(WasmBinaryReader *this,bool requireValid)

{
  bool bVar1;
  uint32_t uVar2;
  undefined7 in_register_00000031;
  string_view str;
  string_view str_00;
  string_view local_60;
  string local_50;
  allocator<char> local_29;
  
  uVar2 = getU32LEB(this);
  str = getByteView(this,(ulong)uVar2);
  str_00._M_str = str._M_str;
  if ((int)CONCAT71(in_register_00000031,requireValid) != 0) {
    str_00._M_len = (size_t)str_00._M_str;
    bVar1 = String::isUTF8((String *)str._M_len,str_00);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"invalid UTF-8 string",&local_29);
      throwError(this,&local_50);
    }
  }
  Name::Name((Name *)&local_60,str);
  return (IString)(IString)local_60;
}

Assistant:

Name WasmBinaryReader::getInlineString(bool requireValid) {
  auto len = getU32LEB();
  auto data = getByteView(len);
  if (requireValid && !String::isUTF8(data)) {
    throwError("invalid UTF-8 string");
  }
  return Name(data);
}